

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O1

string * __thiscall
cmCTestTestHandler::GetTestStatus_abi_cxx11_
          (string *__return_storage_ptr__,cmCTestTestHandler *this,cmCTestTestResult *result)

{
  uint uVar1;
  pointer pcVar2;
  allocator<char> local_9;
  
  uVar1 = result->Status;
  if ((ulong)uVar1 < 10) {
    if (uVar1 == 6) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (result->ExceptionStatus)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,
                 pcVar2 + (result->ExceptionStatus)._M_string_length);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 _ZZN18cmCTestTestHandler13GetTestStatusB5cxx11ERKNS_17cmCTestTestResultEE8statuses_rel
                 + *(int *)(
                           _ZZN18cmCTestTestHandler13GetTestStatusB5cxx11ERKNS_17cmCTestTestResultEE8statuses_rel
                           + (ulong)uVar1 * 4),&local_9);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"No Status","")
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestTestHandler::GetTestStatus(cmCTestTestResult const& result)
{
  static const char* statuses[] = { "Not Run",     "Timeout",   "SEGFAULT",
                                    "ILLEGAL",     "INTERRUPT", "NUMERICAL",
                                    "OTHER_FAULT", "Failed",    "BAD_COMMAND",
                                    "Completed" };
  int status = result.Status;
  if (status < cmCTestTestHandler::NOT_RUN ||
      status > cmCTestTestHandler::COMPLETED) {
    return "No Status";
  }
  if (status == cmCTestTestHandler::OTHER_FAULT) {
    return result.ExceptionStatus;
  }
  return statuses[status];
}